

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O3

void __thiscall LLVMBC::StreamState::append(StreamState *this,MDNode *md,bool decl)

{
  uint uVar1;
  uint uVar2;
  MDOperand *md_00;
  uint64_t local_28;
  
  if (md != (MDNode *)0x0) {
    if (decl) {
      local_28 = MDNode::get_tween_id(md);
      append<char_const(&)[2],unsigned_long,char_const(&)[6]>
                (this,(char (*) [2])0x1c4969,&local_28,(char (*) [6])" = !{");
      uVar1 = MDNode::getNumOperands(md);
      if (uVar1 != 0) {
        uVar1 = 0;
        do {
          md_00 = MDNode::getOperand(md,uVar1);
          append(this,md_00);
          uVar1 = uVar1 + 1;
          uVar2 = MDNode::getNumOperands(md);
          if (uVar1 < uVar2) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
          }
          uVar2 = MDNode::getNumOperands(md);
        } while (uVar1 < uVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"}",1);
    }
    else {
      local_28 = MDNode::get_tween_id(md);
      append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x1c4969,&local_28);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"null",4);
  return;
}

Assistant:

void StreamState::append(MDNode *md, bool decl)
{
	if (md)
	{
		if (decl)
		{
			append("!", md->get_tween_id(), " = !{");
			for (unsigned i = 0; i < md->getNumOperands(); i++)
			{
				append(&md->getOperand(i));
				if (i + 1 < md->getNumOperands())
					append(", ");
			}
			append("}");
		}
		else
			append("!", md->get_tween_id());
	}
	else
		append("null");
}